

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall ImplicitDepLoader::CreatePhonyInEdge(ImplicitDepLoader *this,Node *node)

{
  Edge *pEVar1;
  Edge *phony_edge;
  Node *node_local;
  ImplicitDepLoader *this_local;
  
  phony_edge = (Edge *)node;
  node_local = (Node *)this;
  pEVar1 = Node::in_edge(node);
  if (pEVar1 == (Edge *)0x0) {
    pEVar1 = State::AddEdge(this->state_,&State::kPhonyRule);
    pEVar1->generated_by_dep_loader_ = true;
    Node::set_in_edge((Node *)phony_edge,pEVar1);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              (&pEVar1->outputs_,(value_type *)&phony_edge);
    pEVar1->outputs_ready_ = true;
  }
  return;
}

Assistant:

void ImplicitDepLoader::CreatePhonyInEdge(Node* node) {
  if (node->in_edge())
    return;

  Edge* phony_edge = state_->AddEdge(&State::kPhonyRule);
  phony_edge->generated_by_dep_loader_ = true;
  node->set_in_edge(phony_edge);
  phony_edge->outputs_.push_back(node);

  // RecomputeDirty might not be called for phony_edge if a previous call
  // to RecomputeDirty had caused the file to be stat'ed.  Because previous
  // invocations of RecomputeDirty would have seen this node without an
  // input edge (and therefore ready), we have to set outputs_ready_ to true
  // to avoid a potential stuck build.  If we do call RecomputeDirty for
  // this node, it will simply set outputs_ready_ to the correct value.
  phony_edge->outputs_ready_ = true;
}